

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O1

opj_bool jp2_read_jp2h(opj_jp2_t *jp2,opj_cio_t *cio,opj_jp2_color_t *color)

{
  ushort uVar1;
  opj_common_ptr poVar2;
  opj_jp2_t *poVar3;
  opj_jp2_color_t *poVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  opj_jp2_comps_t *poVar9;
  opj_jp2_cmap_comp_t *poVar10;
  uint *puVar11;
  uchar *puVar12;
  uchar *puVar13;
  opj_jp2_pclr_t *poVar14;
  opj_jp2_cdef_info_t *poVar15;
  opj_jp2_cdef_t *poVar16;
  char *pcVar17;
  opj_common_ptr cinfo;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  opj_jp2_box_t box;
  opj_jp2_box_t box_1;
  opj_jp2_box_t local_7c;
  opj_jp2_t *local_70;
  uchar *local_68;
  uint local_60;
  int local_5c;
  opj_jp2_color_t *local_58;
  uint local_50;
  opj_jp2_box_t local_4c;
  opj_common_ptr local_40;
  opj_jp2_pclr_t *local_38;
  
  poVar2 = jp2->cinfo;
  jp2_read_boxhdr(poVar2,cio,&local_7c);
  do {
    if (local_7c.type != 0x6a703268) {
      if (local_7c.type == 0x6a703263) {
        pcVar17 = "Expected JP2H Marker\n";
        cinfo = poVar2;
        goto LAB_001f7e6a;
      }
      cio_skip(cio,local_7c.length - 8);
      if (cio->end <= cio->bp) {
        return 0;
      }
      jp2_read_boxhdr(poVar2,cio,&local_7c);
    }
  } while (local_7c.type != 0x6a703268);
  cinfo = jp2->cinfo;
  jp2_read_boxhdr(cinfo,cio,&local_4c);
  if (local_4c.type == 0x69686472) {
    uVar5 = cio_read(cio,4);
    jp2->h = uVar5;
    uVar5 = cio_read(cio,4);
    jp2->w = uVar5;
    uVar5 = cio_read(cio,2);
    jp2->numcomps = uVar5;
    poVar9 = (opj_jp2_comps_t *)malloc((ulong)uVar5 * 0xc);
    jp2->comps = poVar9;
    uVar5 = cio_read(cio,1);
    jp2->bpc = uVar5;
    uVar5 = cio_read(cio,1);
    jp2->C = uVar5;
    uVar5 = cio_read(cio,1);
    jp2->UnkC = uVar5;
    uVar5 = cio_read(cio,1);
    jp2->IPR = uVar5;
    iVar6 = cio_tell(cio);
    if (iVar6 - local_4c.init_pos == local_4c.length) {
      local_5c = local_7c.length + local_7c.init_pos;
      local_40 = poVar2;
      if (jp2->bpc != 0xff) {
LAB_001f79c7:
        iVar6 = local_5c;
        jp2_read_boxhdr(local_40,cio,&local_7c);
        iVar7 = cio_tell(cio);
        poVar3 = jp2;
        poVar4 = color;
        if (iVar7 < iVar6) {
          do {
            local_58 = poVar4;
            local_70 = poVar3;
            if ((int)local_7c.type < 0x636f6c72) {
              if (local_7c.type == 0x63646566) {
                if (jp2->ignore_pclr_cmap_cdef != 0) goto LAB_001f7de8;
                if (color->jp2_cdef == (opj_jp2_cdef_t *)0x0) {
                  uVar5 = cio_read(cio,2);
                  uVar8 = uVar5 & 0xffff;
                  if (uVar8 != 0) {
                    poVar15 = (opj_jp2_cdef_info_t *)malloc((ulong)(uVar8 * 6));
                    poVar16 = (opj_jp2_cdef_t *)malloc(0x10);
                    jp2 = local_70;
                    color->jp2_cdef = poVar16;
                    poVar16->info = poVar15;
                    poVar16->n = (unsigned_short)uVar5;
                    lVar18 = 0;
                    do {
                      uVar5 = cio_read(cio,2);
                      *(short *)((long)&poVar15->cn + lVar18) = (short)uVar5;
                      uVar5 = cio_read(cio,2);
                      *(short *)((long)&poVar15->typ + lVar18) = (short)uVar5;
                      uVar5 = cio_read(cio,2);
                      *(short *)((long)&poVar15->asoc + lVar18) = (short)uVar5;
                      lVar18 = lVar18 + 6;
                    } while ((ulong)(uVar8 * 2) * 3 != lVar18);
                    goto LAB_001f7e06;
                  }
                }
                cio_seek(cio,local_7c.init_pos + 8);
                cio_skip(cio,local_7c.length - 8);
                jp2 = local_70;
              }
              else {
LAB_001f7ab6:
                if ((((local_7c.type != 0x636d6170) || (jp2->ignore_pclr_cmap_cdef != 0)) ||
                    (poVar14 = color->jp2_pclr, poVar14 == (opj_jp2_pclr_t *)0x0)) ||
                   (poVar14->cmap != (opj_jp2_cmap_comp_t *)0x0)) goto LAB_001f7de8;
                uVar1 = poVar14->nr_channels;
                poVar10 = (opj_jp2_cmap_comp_t *)malloc((ulong)((uint)uVar1 * 4));
                if (uVar1 != 0) {
                  uVar19 = 0;
                  do {
                    uVar5 = cio_read(cio,2);
                    poVar10[uVar19].cmp = (unsigned_short)uVar5;
                    uVar5 = cio_read(cio,1);
                    poVar10[uVar19].mtyp = (uchar)uVar5;
                    uVar5 = cio_read(cio,1);
                    poVar10[uVar19].pcol = (uchar)uVar5;
                    uVar19 = uVar19 + 1;
                  } while (uVar1 != uVar19);
                }
                color->jp2_pclr->cmap = poVar10;
              }
            }
            else {
              if (local_7c.type == 0x70636c72) {
                if (jp2->ignore_pclr_cmap_cdef != 0) goto LAB_001f7ab6;
                if (color->jp2_pclr == (opj_jp2_pclr_t *)0x0) {
                  local_38 = color->jp2_pclr;
                  uVar5 = cio_read(cio,2);
                  local_50 = uVar5;
                  uVar8 = cio_read(cio,1);
                  local_68 = (uchar *)CONCAT44(local_68._4_4_,uVar8);
                  uVar8 = uVar8 & 0xffff;
                  uVar19 = (ulong)uVar8;
                  local_60 = uVar5 & 0xffff;
                  puVar11 = (uint *)malloc((ulong)(uVar8 * local_60) << 2);
                  puVar12 = (uchar *)malloc(uVar19);
                  puVar13 = (uchar *)malloc(uVar19);
                  poVar14 = (opj_jp2_pclr_t *)malloc(0x28);
                  poVar14->channel_sign = puVar13;
                  poVar14->channel_size = puVar12;
                  poVar14->entries = puVar11;
                  poVar14->nr_entries = (unsigned_short)local_50;
                  poVar14->nr_channels = (unsigned_short)local_68;
                  poVar14->cmap = (opj_jp2_cmap_comp_t *)0x0;
                  color->jp2_pclr = poVar14;
                  if (uVar8 != 0) {
                    uVar20 = 0;
                    do {
                      uVar5 = cio_read(cio,1);
                      puVar12[uVar20] = ((byte)uVar5 & 0x7f) + 1;
                      puVar13[uVar20] = (byte)uVar5 >> 7;
                      uVar20 = uVar20 + 1;
                    } while (uVar19 != uVar20);
                  }
                  if (local_60 != 0) {
                    uVar5 = 0;
                    do {
                      if (uVar19 != 0) {
                        local_68 = (uchar *)CONCAT44(local_68._4_4_,uVar5);
                        lVar18 = 0;
                        uVar20 = 0;
                        do {
                          uVar5 = cio_read(cio,(uint)(puVar12[uVar20] >> 3));
                          puVar11[uVar20] = uVar5;
                          uVar20 = uVar20 + 1;
                          lVar18 = lVar18 + -4;
                        } while (uVar19 != uVar20);
                        puVar11 = (uint *)((long)puVar11 - lVar18);
                        uVar5 = (uint)local_68;
                      }
                      uVar5 = uVar5 + 1;
                    } while (uVar5 != local_60);
                  }
                  jp2 = local_70;
                  color = local_58;
                  if (local_38 == (opj_jp2_pclr_t *)0x0) goto LAB_001f7e06;
                }
              }
              else if ((local_7c.type == 0x636f6c72) && (color->jp2_has_colr == '\0')) {
                poVar2 = jp2->cinfo;
                uVar5 = cio_read(cio,1);
                jp2->meth = uVar5;
                uVar5 = cio_read(cio,1);
                jp2->precedence = uVar5;
                uVar5 = cio_read(cio,1);
                jp2->approx = uVar5;
                if (jp2->meth == 2) {
                  iVar7 = local_7c.length + local_7c.init_pos;
                  iVar6 = cio_tell(cio);
                  uVar5 = iVar7 - iVar6;
                  pcVar17 = "Error with COLR box size\n";
                  if (-1 < (int)uVar5) {
                    if (uVar5 != 0) {
                      local_68 = cio_getbp(cio);
                      puVar12 = (uchar *)malloc((ulong)uVar5);
                      poVar4 = local_58;
                      local_58->icc_profile_buf = puVar12;
                      local_58->icc_profile_len = uVar5;
                      iVar6 = cio_tell(cio);
                      cio_skip(cio,iVar7 - iVar6);
                      memcpy(poVar4->icc_profile_buf,local_68,(ulong)uVar5);
                    }
                    goto LAB_001f7da5;
                  }
                }
                else {
                  if (jp2->meth == 1) {
                    uVar5 = cio_read(cio,4);
                    local_70->enumcs = uVar5;
                  }
LAB_001f7da5:
                  iVar6 = cio_tell(cio);
                  pcVar17 = "Error with COLR Box\n";
                  if (iVar6 - local_7c.init_pos == local_7c.length) {
                    local_58->jp2_has_colr = '\x01';
                    jp2 = local_70;
                    color = local_58;
                    goto LAB_001f7e06;
                  }
                }
                opj_event_msg(poVar2,1,pcVar17);
                jp2 = local_70;
                color = local_58;
              }
LAB_001f7de8:
              cio_seek(cio,local_7c.init_pos + 8);
              cio_skip(cio,local_7c.length - 8);
            }
LAB_001f7e06:
            jp2_read_boxhdr(local_40,cio,&local_7c);
            iVar7 = cio_tell(cio);
            iVar6 = local_5c;
            poVar3 = local_70;
            poVar4 = local_58;
          } while (iVar7 < local_5c);
        }
        cio_seek(cio,iVar6);
        return (uint)(color->jp2_has_colr == '\x01');
      }
      cinfo = jp2->cinfo;
      jp2_read_boxhdr(cinfo,cio,&local_4c);
      if (local_4c.type == 0x62706363) {
        if (jp2->numcomps != 0) {
          lVar18 = 8;
          uVar19 = 0;
          do {
            uVar5 = cio_read(cio,1);
            *(uint *)((long)&jp2->comps->depth + lVar18) = uVar5;
            uVar19 = uVar19 + 1;
            lVar18 = lVar18 + 0xc;
          } while (uVar19 < jp2->numcomps);
        }
        iVar6 = cio_tell(cio);
        if (iVar6 - local_4c.init_pos == local_4c.length) goto LAB_001f79c7;
        pcVar17 = "Error with BPCC Box\n";
      }
      else {
        pcVar17 = "Expected BPCC Marker\n";
      }
    }
    else {
      pcVar17 = "Error with IHDR Box\n";
    }
  }
  else {
    pcVar17 = "Expected IHDR Marker\n";
  }
LAB_001f7e6a:
  opj_event_msg(cinfo,1,pcVar17);
  return 0;
}

Assistant:

opj_bool jp2_read_jp2h(opj_jp2_t *jp2, opj_cio_t *cio, opj_jp2_color_t *color) 
{
	opj_jp2_box_t box;
	int jp2h_end;

	opj_common_ptr cinfo = jp2->cinfo;

	jp2_read_boxhdr(cinfo, cio, &box);
	do 
   {
	if (JP2_JP2H != box.type) 
  {
	if (box.type == JP2_JP2C) 
 {
	opj_event_msg(cinfo, EVT_ERROR, "Expected JP2H Marker\n");
	return OPJ_FALSE;
 }
	cio_skip(cio, box.length - 8);

	if(cio->bp >= cio->end) return OPJ_FALSE;

	jp2_read_boxhdr(cinfo, cio, &box);
  }
   } while(JP2_JP2H != box.type);

	if (!jp2_read_ihdr(jp2, cio))
		return OPJ_FALSE;
	jp2h_end = box.init_pos + box.length;

	if (jp2->bpc == 255) 
   {
	if (!jp2_read_bpcc(jp2, cio))
		return OPJ_FALSE;
   }
	jp2_read_boxhdr(cinfo, cio, &box);

	while(cio_tell(cio) < jp2h_end)
   {
	if(box.type == JP2_COLR)
  {
	if( !jp2_read_colr(jp2, cio, &box, color))
 {
    cio_seek(cio, box.init_pos + 8);
    cio_skip(cio, box.length - 8);
 }
    jp2_read_boxhdr(cinfo, cio, &box);
    continue;
  }
    if(box.type == JP2_CDEF && !jp2->ignore_pclr_cmap_cdef)
  {
    if( !jp2_read_cdef(jp2, cio, &box, color))
 {
    cio_seek(cio, box.init_pos + 8);
    cio_skip(cio, box.length - 8);
 }
    jp2_read_boxhdr(cinfo, cio, &box);
    continue;
  }
    if(box.type == JP2_PCLR && !jp2->ignore_pclr_cmap_cdef)
  {
    if( !jp2_read_pclr(jp2, cio, &box, color))
 {
    cio_seek(cio, box.init_pos + 8);
    cio_skip(cio, box.length - 8);
 }
    jp2_read_boxhdr(cinfo, cio, &box);
    continue;
  }
    if(box.type == JP2_CMAP && !jp2->ignore_pclr_cmap_cdef)
  {
    if( !jp2_read_cmap(jp2, cio, &box, color))
 {
    cio_seek(cio, box.init_pos + 8);
    cio_skip(cio, box.length - 8);
 }
    jp2_read_boxhdr(cinfo, cio, &box);
    continue;
  }
	cio_seek(cio, box.init_pos + 8);
	cio_skip(cio, box.length - 8);
	jp2_read_boxhdr(cinfo, cio, &box);

   }/* while(cio_tell(cio) < box_end) */

	cio_seek(cio, jp2h_end);

/* Part 1, I.5.3.3 : 'must contain at least one' */
	return (color->jp2_has_colr == 1);

}